

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::ReplaceNonUniformAccessWithSwitchCase
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *access_chain_final_user,
          Instruction *access_chain,uint32_t number_of_elements,
          deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *insts_to_be_cloned)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t merge_id;
  IRContext *pIVar4;
  BasicBlock *block_00;
  Instruction *separation_begin_inst;
  BasicBlock *this_00;
  Function *this_01;
  BasicBlock *pBVar5;
  pointer pBVar6;
  uint32_t phi_id;
  uint32_t access_chain_index_var_id;
  uint32_t default_block_id;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  default_block;
  uint32_t phi_operand;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_c0;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> case_block;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  old_ids_to_new_ids_for_cloned_insts;
  undefined1 local_78 [4];
  uint32_t idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> case_block_ids;
  vector<unsigned_int,_std::allocator<unsigned_int>_> phi_operands;
  Function *function;
  BasicBlock *merge_block;
  BasicBlock *block;
  deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *insts_to_be_cloned_local;
  uint32_t number_of_elements_local;
  Instruction *access_chain_local;
  Instruction *access_chain_final_user_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  pIVar4 = Pass::context(&this->super_Pass);
  block_00 = IRContext::get_instr_block(pIVar4,access_chain_final_user);
  if (block_00 != (BasicBlock *)0x0) {
    separation_begin_inst =
         utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                   (&access_chain_final_user->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    this_00 = SeparateInstructionsIntoNewBlock(this,block_00,separation_begin_inst);
    this_01 = BasicBlock::GetParent(block_00);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &case_block_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
    for (old_ids_to_new_ids_for_cloned_insts._M_h._M_single_bucket._4_4_ = 0;
        old_ids_to_new_ids_for_cloned_insts._M_h._M_single_bucket._4_4_ < number_of_elements;
        old_ids_to_new_ids_for_cloned_insts._M_h._M_single_bucket._4_4_ =
             old_ids_to_new_ids_for_cloned_insts._M_h._M_single_bucket._4_4_ + 1) {
      std::
      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                       *)&case_block);
      uVar2 = BasicBlock::id(this_00);
      pBVar5 = CreateCaseBlock(this,access_chain,
                               old_ids_to_new_ids_for_cloned_insts._M_h._M_single_bucket._4_4_,
                               insts_to_be_cloned,uVar2,
                               (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)&case_block);
      std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
      unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
                ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>
                  *)&local_c0,pBVar5);
      pBVar6 = std::
               unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ::operator->(&local_c0);
      phi_operand = BasicBlock::id(pBVar6);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,&phi_operand);
      opt::Function::InsertBasicBlockBefore(this_01,&local_c0,this_00);
      bVar1 = opt::Instruction::HasResultId(access_chain_final_user);
      if (bVar1) {
        uVar2 = opt::Instruction::result_id(access_chain_final_user);
        default_block._M_t.
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl._4_4_ =
             anon_unknown_0::GetValueWithKeyExistenceCheck
                       (uVar2,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                               *)&case_block);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   &case_block_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value_type_conflict *)
                   ((long)&default_block._M_t.
                           super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl +
                   4));
      }
      std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
      ~unique_ptr(&local_c0);
      std::
      unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)&case_block);
    }
    bVar1 = opt::Instruction::HasResultId(access_chain_final_user);
    uVar2 = BasicBlock::id(this_00);
    pBVar5 = CreateDefaultBlock(this,bVar1,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                &case_block_ids.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,uVar2);
    std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
    unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
              ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>
                *)&access_chain_index_var_id,pBVar5);
    pBVar6 = std::
             unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ::operator->((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           *)&access_chain_index_var_id);
    uVar2 = BasicBlock::id(pBVar6);
    opt::Function::InsertBasicBlockBefore
              (this_01,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)&access_chain_index_var_id,this_00);
    uVar3 = descsroautil::GetFirstIndexOfAccessChain(access_chain);
    merge_id = BasicBlock::id(this_00);
    AddSwitchForAccessChain
              (this,block_00,uVar3,uVar2,merge_id,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &case_block_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      uVar2 = CreatePhiInstruction
                        (this,this_00,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &case_block_ids.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78,uVar2);
      pIVar4 = Pass::context(&this->super_Pass);
      uVar3 = opt::Instruction::result_id(access_chain_final_user);
      IRContext::ReplaceAllUsesWith(pIVar4,uVar3,uVar2);
    }
    uVar2 = BasicBlock::id(block_00);
    uVar3 = BasicBlock::id(this_00);
    ReplacePhiIncomingBlock(this,uVar2,uVar3);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&access_chain_index_var_id);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &case_block_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::ReplaceNonUniformAccessWithSwitchCase(
    Instruction* access_chain_final_user, Instruction* access_chain,
    uint32_t number_of_elements,
    const std::deque<Instruction*>& insts_to_be_cloned) const {
  auto* block = context()->get_instr_block(access_chain_final_user);
  // If the instruction does not belong to a block (i.e. in the case of
  // OpDecorate), no replacement is needed.
  if (!block) return;

  // Create merge block and add terminator
  auto* merge_block = SeparateInstructionsIntoNewBlock(
      block, access_chain_final_user->NextNode());

  auto* function = block->GetParent();

  // Add case blocks
  std::vector<uint32_t> phi_operands;
  std::vector<uint32_t> case_block_ids;
  for (uint32_t idx = 0; idx < number_of_elements; ++idx) {
    std::unordered_map<uint32_t, uint32_t> old_ids_to_new_ids_for_cloned_insts;
    std::unique_ptr<BasicBlock> case_block(CreateCaseBlock(
        access_chain, idx, insts_to_be_cloned, merge_block->id(),
        &old_ids_to_new_ids_for_cloned_insts));
    case_block_ids.push_back(case_block->id());
    function->InsertBasicBlockBefore(std::move(case_block), merge_block);

    // Keep the operand for OpPhi
    if (!access_chain_final_user->HasResultId()) continue;
    uint32_t phi_operand =
        GetValueWithKeyExistenceCheck(access_chain_final_user->result_id(),
                                      old_ids_to_new_ids_for_cloned_insts);
    phi_operands.push_back(phi_operand);
  }

  // Create default block
  std::unique_ptr<BasicBlock> default_block(
      CreateDefaultBlock(access_chain_final_user->HasResultId(), &phi_operands,
                         merge_block->id()));
  uint32_t default_block_id = default_block->id();
  function->InsertBasicBlockBefore(std::move(default_block), merge_block);

  // Create OpSwitch
  uint32_t access_chain_index_var_id =
      descsroautil::GetFirstIndexOfAccessChain(access_chain);
  AddSwitchForAccessChain(block, access_chain_index_var_id, default_block_id,
                          merge_block->id(), case_block_ids);

  // Create phi instructions
  if (!phi_operands.empty()) {
    uint32_t phi_id = CreatePhiInstruction(merge_block, phi_operands,
                                           case_block_ids, default_block_id);
    context()->ReplaceAllUsesWith(access_chain_final_user->result_id(), phi_id);
  }

  // Replace OpPhi incoming block operand that uses |block| with |merge_block|
  ReplacePhiIncomingBlock(block->id(), merge_block->id());
}